

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

void ga_dscal_patch_(Integer *g_a,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,
                    DoublePrecision *alpha)

{
  void *in_RDX;
  Integer *in_RSI;
  Integer *in_RDI;
  Integer atype;
  Integer in_stack_00000168;
  char *in_stack_00000170;
  Integer *in_stack_000001c8;
  Integer in_stack_000001d0;
  undefined8 local_38;
  
  pnga_inquire_type(in_stack_000001d0,in_stack_000001c8);
  if (local_38 != 0x3ec) {
    pnga_error(in_stack_00000170,in_stack_00000168);
  }
  sga_scale_patch((Integer)jhi,(Integer *)alpha,(Integer *)atype,in_RDI,in_RSI,in_RDX);
  return;
}

Assistant:

void FATR ga_dscal_patch_(Integer *g_a, Integer *ilo, Integer *ihi, Integer *jlo, Integer *jhi, DoublePrecision *alpha)
{
    Integer atype;

    pnga_inquire_type(*g_a, &atype);
    if (atype != C_DBL) pnga_error(" wrong types ", 0L);
    sga_scale_patch(*g_a, ilo, ihi, jlo, jhi, alpha);
}